

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

double wdm::utils::perm_sum(vector<double,_std::allocator<double>_> *x,size_t k)

{
  vector<double,_std::allocator<double>_> *in_RSI;
  double dVar1;
  double __x;
  undefined1 auVar2 [16];
  size_t i;
  double s;
  unsigned_long in_stack_ffffffffffffff88;
  __type in_stack_ffffffffffffff90;
  utils *this;
  utils local_40 [24];
  vector<double,_std::allocator<double>_> *local_28;
  double local_8;
  
  if (in_RSI == (vector<double,_std::allocator<double>_> *)0x0) {
    local_8 = 1.0;
  }
  else {
    local_8 = 0.0;
    for (local_28 = (vector<double,_std::allocator<double>_> *)0x1; local_28 <= in_RSI;
        local_28 = (vector<double,_std::allocator<double>_> *)
                   ((long)&(local_28->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + 1)) {
      in_stack_ffffffffffffff90 =
           std::pow<double,unsigned_long>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      dVar1 = perm_sum(in_RSI,(size_t)local_8);
      __x = in_stack_ffffffffffffff90 * dVar1;
      this = local_40;
      pow(this,__x,dVar1);
      dVar1 = sum((vector<double,_std::allocator<double>_> *)this);
      local_8 = __x * dVar1 + local_8;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)this);
    }
    auVar2._8_4_ = (int)((ulong)in_RSI >> 0x20);
    auVar2._0_8_ = in_RSI;
    auVar2._12_4_ = 0x45300000;
    local_8 = local_8 / ((auVar2._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0));
  }
  return local_8;
}

Assistant:

inline double perm_sum(const std::vector<double>& x, size_t k)
{
    if (k == 0)
        return 1.0;
    double s = 0;
    for (size_t i = 1; i <= k; i++)
        s += std::pow(-1.0, i - 1) * perm_sum(x, k - i) * sum(pow(x, i));
    return s / k;
}